

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

int readline(void)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  char (*__src) [80];
  char *pcVar10;
  int iVar11;
  char num [8];
  
  lVar5 = 0;
  do {
    for (; lVar5 != 0x9e; lVar5 = lVar5 + 1) {
      prlnbuf[lVar5] = ' ';
    }
    if (expand_macro != 0) {
      if (mlptr != (t_line *)0x0) {
LAB_0010c9e5:
        pbVar8 = (byte *)mlptr->data;
        iVar2 = 0x1a;
        break;
      }
      lVar5 = (long)midx;
      while (lVar5 != 1) {
        mlptr = *(t_line **)(&DAT_0011f9a8 + lVar5 * 8);
        lVar5 = lVar5 + -1;
        if (mlptr != (t_line *)0x0) {
          mcounter = mcntstack[lVar5];
          midx = (int)lVar5;
          goto LAB_0010c9e5;
        }
      }
      midx = 0;
      mlptr = (t_line *)0x0;
      mcounter = mcntstack[0];
      expand_macro = 0;
    }
    iVar2 = slnum + 1;
    pcVar10 = prlnbuf + 4;
    slnum = iVar2;
    for (; iVar2 != 0; iVar2 = iVar2 / 10) {
      *pcVar10 = (char)(iVar2 % 10) + '0';
      pcVar10 = pcVar10 + -1;
    }
    iVar2 = getc((FILE *)in_fp);
    if (iVar2 != -1) {
      iVar7 = 0x1a;
      goto LAB_0010cbca;
    }
    iVar2 = close_input();
    lVar5 = 0;
    if (iVar2 != 0) {
      return -1;
    }
  } while( true );
LAB_0010c9f9:
  bVar1 = *pbVar8;
  if (bVar1 == 0x5c) {
    pbVar9 = pbVar8 + 2;
    bVar1 = pbVar8[1];
    prlnbuf[iVar2] = '\0';
    if (bVar1 != 0x40) {
      if (bVar1 == 0x3f) {
        bVar1 = *pbVar9;
        if ((byte)(bVar1 - 0x31) < 9) {
          pbVar9 = pbVar8 + 3;
          uVar3 = macro_getargtype(marg[midx][bVar1 - 0x31]);
          sprintf(num,"%i",(ulong)uVar3);
LAB_0010cb42:
          iVar7 = 1;
          __src = (char (*) [80])num;
          goto LAB_0010cb45;
        }
      }
      else {
        if (bVar1 == 0x23) {
          lVar5 = 0x280;
          uVar6 = 10;
          do {
            if (lVar5 == -0x50) {
              uVar6 = 0;
              break;
            }
            uVar6 = (ulong)((int)uVar6 - 1);
            pcVar10 = marg[midx][0] + lVar5;
            lVar5 = lVar5 + -0x50;
          } while (*pcVar10 == '\0');
          sprintf(num,"%i",uVar6);
          goto LAB_0010cb42;
        }
        if ((byte)(bVar1 - 0x31) < 9) {
          lVar5 = (long)midx;
          sVar4 = strlen(marg[lVar5][(byte)(bVar1 - 0x31)]);
          iVar7 = (int)sVar4;
          __src = marg[lVar5] + (byte)(bVar1 - 0x31);
          goto LAB_0010cb45;
        }
      }
      pcVar10 = "Invalid macro argument index!";
LAB_0010cbad:
      error(pcVar10);
      return -1;
    }
    sprintf(num,"%05i",(ulong)(uint)mcounter);
    iVar7 = 5;
    __src = (char (*) [80])num;
LAB_0010cb45:
    iVar11 = iVar2 + iVar7;
    if (0x9c < iVar11) {
      pcVar10 = "Invalid line length!";
      goto LAB_0010cbad;
    }
    strncpy(prlnbuf + iVar2,*__src,(long)iVar7);
  }
  else {
    if (bVar1 == 0) {
      prlnbuf[iVar2] = '\0';
      mlptr = mlptr->next;
      return 0;
    }
    pbVar9 = pbVar8 + 1;
    iVar11 = iVar2 + 1;
    prlnbuf[iVar2] = bVar1;
  }
  pbVar8 = pbVar9;
  iVar2 = iVar11;
  if (0x9c < iVar11) {
    iVar2 = 0x9d;
  }
  goto LAB_0010c9f9;
LAB_0010cbca:
  if ((iVar2 == -1) || (iVar2 == 10)) goto LAB_0010cc5f;
  if (iVar2 == 0xd) {
    iVar2 = getc((FILE *)in_fp);
    if ((iVar2 != -1) && (iVar2 != 10)) {
      ungetc(iVar2,(FILE *)in_fp);
    }
LAB_0010cc5f:
    prlnbuf[iVar7] = '\0';
    return 0;
  }
  prlnbuf[iVar7] = (char)iVar2;
  iVar7 = (uint)(iVar7 < 0x9e) + iVar7;
  if (iVar2 == 9) {
    *(undefined1 *)((long)iVar7 + 0x329ebf) = 0x20;
    iVar7 = (iVar7 - (iVar7 + -0x1b) % 8) + 7;
  }
  iVar2 = getc((FILE *)in_fp);
  goto LAB_0010cbca;
}

Assistant:

int
readline(void)
{
	char *ptr, *arg, num[8];
	int j, n;
	int	i;		/* pointer into prlnbuf */
	int	c;		/* current character		*/
	int	temp;	/* temp used for line number conversion */

start:
	for (i = 0; i < LAST_CH_POS; i++)
		prlnbuf[i] = ' ';

	/* if 'expand_macro' is set get a line from macro buffer instead */
	if (expand_macro) {
		if (mlptr == NULL) {
			while (mlptr == NULL) {
				midx--;
				mlptr = mstack[midx];
				mcounter = mcntstack[midx];
				if (midx == 0) {
					mlptr = NULL;
					expand_macro = 0;
					break;
				}
			}
		}

		/* expand line */
		if (mlptr) {
			i = SFIELD;
			ptr = mlptr->data;
			for (;;) {
				c = *ptr++;
				if (c == '\0')
					break;
				if (c != '\\')
					prlnbuf[i++] = c;
				else {
					c = *ptr++;
					prlnbuf[i] = '\0';

					/* \@ */
					if (c == '@') {
						n = 5;
						sprintf(num, "%05i", mcounter);
						arg = num;
					}

					/* \# */
					else if (c == '#') {
						for (j = 9; j > 0; j--)
							if (strlen(marg[midx][j - 1]))
								break;
						n = 1;
						sprintf(num, "%i", j);
						arg = num;
					}

					/* \?1 - \?9 */
					else if (c == '?') {
						c = *ptr++;
						if (c >= '1' && c <= '9') {
							n = 1;
							sprintf(num, "%i", macro_getargtype(marg[midx][c - '1']));
							arg = num;
						}
						else {
							error("Invalid macro argument index!");
							return (-1);
						}
					}

					/* \1 - \9 */
					else if (c >= '1' && c <= '9') {
						j   = c - '1';
						n   = strlen(marg[midx][j]);
						arg = marg[midx][j];
					}

					/* unknown macro special command */
					else {
						error("Invalid macro argument index!");
						return (-1);
					}

					/* check for line overflow */
					if ((i + n) >= LAST_CH_POS - 1) {
						error("Invalid line length!");
						return (-1);
					}

					/* copy macro string */
					strncpy(&prlnbuf[i], arg, n);
					i += n;
				}
				if (i >= LAST_CH_POS - 1)
					i  = LAST_CH_POS - 1;
			}
			prlnbuf[i] = '\0';
			mlptr = mlptr->next;
			return (0);
		}
	}

	/* put source line number into prlnbuf */
	i = 4;
	temp = ++slnum;
	while (temp != 0) {
		prlnbuf[i--] = temp % 10 + '0';
		temp /= 10;
	}

	/* get a line */
	i = SFIELD;
	c = getc(in_fp);
	if (c == EOF) {
		if (close_input())
			return (-1);
		goto start;
	}
	for (;;) {
		/* check for the end of line */
		if (c == '\r') {
			c = getc(in_fp);
			if (c == '\n' || c == EOF)
				break;
			ungetc(c, in_fp);
			break;
		}
		if (c == '\n' || c == EOF)
			break;

		/* store char in the line buffer */
		prlnbuf[i] = c;
		i += (i < LAST_CH_POS) ? 1 : 0;

		/* expand tab char to space */
		if (c == '\t') {
			prlnbuf[--i] = ' ';
			i += (8 - ((i - SFIELD) % 8));
		}

		/* get next char */
		c = getc(in_fp);
	}
	prlnbuf[i] = '\0';
	return(0);
}